

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall DepfileParserTestBackSlashes::Run(DepfileParserTestBackSlashes *this)

{
  Test *pTVar1;
  bool bVar2;
  bool condition;
  size_type sVar3;
  string local_60;
  uint local_40;
  undefined1 local_30 [8];
  string err;
  DepfileParserTestBackSlashes *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  bVar2 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,
                     "Project\\Dir\\Build\\Release8\\Foo\\Foo.res : \\\n  Dir\\Library\\Foo.rc \\\n  Dir\\Library\\Version\\Bar.h \\\n  Dir\\Library\\Foo.ico \\\n  Project\\Thing\\Bar.tlb \\\n"
                     ,(string *)local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/depfile_parser_test.cc"
             ,0x50,
             "Parse( \"Project\\\\Dir\\\\Build\\\\Release8\\\\Foo\\\\Foo.res : \\\\\\n\" \"  Dir\\\\Library\\\\Foo.rc \\\\\\n\" \"  Dir\\\\Library\\\\Version\\\\Bar.h \\\\\\n\" \"  Dir\\\\Library\\\\Foo.ico \\\\\\n\" \"  Project\\\\Thing\\\\Bar.tlb \\\\\\n\", &err)"
            );
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/depfile_parser_test.cc"
                     ,0x51,"\"\" == err");
  pTVar1 = g_current_test;
  if (bVar2) {
    StringPiece::AsString_abi_cxx11_(&local_60,&(this->super_DepfileParserTest).parser_.out_);
    condition = std::operator==("Project\\Dir\\Build\\Release8\\Foo\\Foo.res",&local_60);
    testing::Test::Check
              (pTVar1,condition,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/depfile_parser_test.cc"
               ,0x53,
               "\"Project\\\\Dir\\\\Build\\\\Release8\\\\Foo\\\\Foo.res\" == parser_.out_.AsString()"
              );
    std::__cxx11::string::~string((string *)&local_60);
    pTVar1 = g_current_test;
    sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                      (&(this->super_DepfileParserTest).parser_.ins_);
    testing::Test::Check
              (pTVar1,sVar3 == 4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/depfile_parser_test.cc"
               ,0x54,"4u == parser_.ins_.size()");
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  local_40 = (uint)!bVar2;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DepfileParserTest, BackSlashes) {
  string err;
  EXPECT_TRUE(Parse(
"Project\\Dir\\Build\\Release8\\Foo\\Foo.res : \\\n"
"  Dir\\Library\\Foo.rc \\\n"
"  Dir\\Library\\Version\\Bar.h \\\n"
"  Dir\\Library\\Foo.ico \\\n"
"  Project\\Thing\\Bar.tlb \\\n",
      &err));
  ASSERT_EQ("", err);
  EXPECT_EQ("Project\\Dir\\Build\\Release8\\Foo\\Foo.res",
            parser_.out_.AsString());
  EXPECT_EQ(4u, parser_.ins_.size());
}